

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::peer_connection::send_buffer(peer_connection *this,span<const_char> buf)

{
  chained_buffer *this_00;
  uint uVar1;
  ulong __n;
  size_t size;
  ulong uVar2;
  span<const_char> buf_00;
  buffer snd_buf;
  buffer local_58;
  buffer local_40;
  
  uVar2 = buf.m_len;
  buf_00.m_ptr = buf.m_ptr;
  this_00 = &this->m_send_buffer;
  uVar1 = chained_buffer::space_in_last_buffer(this_00);
  if ((int)(uint)buf.m_len <= (int)uVar1) {
    uVar1 = (uint)buf.m_len;
  }
  if (0 < (int)uVar1) {
    buf_00.m_len._0_4_ = uVar1;
    buf_00.m_len._4_4_ = 0;
    chained_buffer::append(this_00,buf_00);
    buf_00.m_ptr = buf_00.m_ptr + uVar1;
    uVar2 = uVar2 - uVar1;
  }
  if (uVar2 != 0) {
    size = 0x80;
    if (0x80 < (int)uVar2) {
      size = uVar2 & 0xffffffff;
    }
    aux::buffer::buffer(&local_58,size);
    __n = uVar2;
    if ((long)size < (long)uVar2) {
      __n = size;
    }
    memmove(local_58.m_begin,buf_00.m_ptr,__n);
    local_40.m_begin = local_58.m_begin;
    local_40.m_size = local_58.m_size;
    local_58.m_begin = (char *)0x0;
    local_58.m_size = 0;
    chained_buffer::append_buffer<libtorrent::aux::buffer>(this_00,&local_40,(int)uVar2);
    free(local_40.m_begin);
    setup_send(this);
    free(local_58.m_begin);
  }
  return;
}

Assistant:

void peer_connection::send_buffer(span<char const> buf)
	{
		TORRENT_ASSERT(is_single_thread());

		int const free_space = std::min(
			m_send_buffer.space_in_last_buffer(), int(buf.size()));
		if (free_space > 0)
		{
			char* dst = m_send_buffer.append(buf.first(free_space));

			// this should always succeed, because we checked how much space
			// there was up-front
			TORRENT_UNUSED(dst);
			TORRENT_ASSERT(dst != nullptr);
			buf = buf.subspan(free_space);
		}
		if (buf.empty()) return;

		// allocate a buffer and initialize the beginning of it with 'buf'
		aux::buffer snd_buf(std::max(int(buf.size()), 128), buf);
		m_send_buffer.append_buffer(std::move(snd_buf), int(buf.size()));

		setup_send();
	}